

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

ssize_t __thiscall
ktx::ValidationContextMemory::read
          (ValidationContextMemory *this,int __fd,void *__buf,size_t __nbytes)

{
  void *pvVar1;
  undefined4 in_register_00000034;
  size_t bytesAvailable;
  ulong local_48;
  size_t local_40;
  ulong local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  local_38 = CONCAT44(in_register_00000034,__fd);
  local_48 = 0;
  if (local_38 <= this->memorySize) {
    local_48 = this->memorySize - local_38;
  }
  local_40 = __nbytes;
  if (local_48 < __nbytes) {
    ValidationContext::
    fatal<unsigned_long&,unsigned_long&,std::basic_string_view<char,std::char_traits<char>>&,unsigned_long_const&>
              (&this->super_ValidationContext,&IOError::UnexpectedEOF,&local_40,&local_38,&local_30,
               &local_48);
  }
  pvVar1 = memcpy(__buf,this->memoryData + local_38,local_40);
  return (ssize_t)pvVar1;
}

Assistant:

virtual void read(std::size_t offset, void* readDst, std::size_t readSize, std::string_view name) override {
        const auto bytesAvailable = offset > memorySize ? 0 : memorySize - offset;

        if (bytesAvailable < readSize)
            fatal(IOError::UnexpectedEOF, readSize, offset, name, bytesAvailable);

        std::memcpy(readDst, memoryData + offset, readSize);
    }